

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O3

void __thiscall GoState<3U,_4U>::dump_board(GoState<3U,_4U> *this,char *file_name)

{
  ostream *poVar1;
  uchar (*pauVar2) [4];
  int i;
  long lVar3;
  char cVar4;
  int j;
  long lVar5;
  ofstream fout;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,file_name,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"static const int M = ",0x15);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"static const int N = ",0x15);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"char board[M][N+1] = {",0x16);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  cVar4 = (char)(ostream *)&local_230;
  std::ostream::put(cVar4);
  std::ostream::flush();
  pauVar2 = this->board;
  lVar3 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t\"",2);
    lVar5 = 0;
    do {
      if ((*pauVar2)[lVar5] == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,".",1);
      }
      else {
        std::ostream::operator<<((ostream *)&local_230,(uint)(*pauVar2)[lVar5]);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\",",2);
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
    pauVar2 = pauVar2 + 1;
  } while (lVar3 != 3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"};",2);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

virtual void dump_board(const char* file_name) const
	{
		std::ofstream fout(file_name);
		fout << "static const int M = " << M << ";" << std::endl;
		fout << "static const int N = " << N << ";" << std::endl;
		fout << "char board[M][N+1] = {" << std::endl;
		for (int i = 0; i < M; ++i) {
			fout << "\t\"";
			for (int j = 0; j < N; ++j) {
				if (board[i][j] == empty) fout << ".";
				else fout << int(board[i][j]);
			}
			fout << "\"," << std::endl;
		}
		fout << "};" << std::endl;
	}